

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

ssize_t __thiscall lrit::File::read(File *this,int __fd,void *__buf,size_t __nbytes)

{
  pointer pbVar1;
  char *pcVar2;
  undefined4 in_register_00000034;
  size_type __new_size;
  int bytes;
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ifs;
  vector<char,_std::allocator<char>_> *out;
  File *this_00;
  undefined4 in_stack_ffffffffffffffd4;
  File *this_01;
  
  __new_size = CONCAT44(in_register_00000034,__fd);
  this_00 = this;
  this_01 = this;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x17897f);
  getData(this_01);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,(int)(*(long *)(__new_size + 0x90) + 7U >> 3)),
             __new_size);
  pbVar1 = std::
           unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           ::operator->((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                         *)0x1789c3);
  pcVar2 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x1789d1);
  std::vector<char,_std::allocator<char>_>::size((vector<char,_std::allocator<char>_> *)this);
  std::istream::read((char *)pbVar1,(long)pcVar2);
  std::
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                 *)this_00);
  return (ssize_t)this_00;
}

Assistant:

std::vector<char> File::read() const {
  std::vector<char> out;

  auto ifs = getData();
  auto bytes = (int) ((ph_.dataLength + 7) / 8);
  out.resize(bytes);
  ifs->read(out.data(), out.size());
  return out;
}